

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CGL::Application::mouse_released(Application *this,e_mouse_button b)

{
  Vector2D VVar1;
  OfflineRenderer *pOVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  ostream *poVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 local_58 [16];
  double local_48;
  undefined1 auStack_38 [16];
  
  if (b == MIDDLE) {
    this->middleDown = false;
  }
  else if (b == RIGHT) {
    if (this->mode == RENDER_MODE) {
      auVar4._0_4_ = this->mouseX;
      auVar4._4_4_ = this->mouseY;
      auVar4[8] = this->leftDown;
      auVar4[9] = this->rightDown;
      auVar4[10] = this->middleDown;
      auVar4._11_5_ = *(undefined5 *)&this->field_0x383;
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)((float)this->screenH - this->mouseY)),0x10);
      vcvtps2pd_avx(auVar4);
      (*this->renderer->_vptr_OfflineRenderer[8])();
      (*this->renderer->_vptr_OfflineRenderer[6])();
      (*this->renderer->_vptr_OfflineRenderer[10])();
    }
    this->rightDown = false;
  }
  else if (((b == LEFT) && (this->leftDown = false, this->mode == RENDER_MODE)) &&
          (pOVar2 = this->renderer, pOVar2->render_cell == true)) {
    auVar7._0_8_ = this->screenW;
    auVar7._8_8_ = this->screenH;
    auVar9._8_8_ = 0x4330000000000000;
    auVar9._0_8_ = 0x4330000000000000;
    auVar4 = vpblendd_avx2(auVar7,(undefined1  [16])0x0,10);
    auVar4 = vpor_avx(auVar4,auVar9);
    auVar10._8_8_ = 0x4530000000000000;
    auVar10._0_8_ = 0x4530000000000000;
    auVar7 = vpsrlq_avx(auVar7,0x20);
    auVar7 = vpor_avx(auVar7,auVar10);
    auVar11._8_8_ = 0x4530000000100000;
    auVar11._0_8_ = 0x4530000000100000;
    auVar7 = vsubpd_avx(auVar7,auVar11);
    auVar3._0_8_ = (pOVar2->cell_tl).x;
    auVar3._8_8_ = (pOVar2->cell_tl).y;
    auVar3._16_8_ = (pOVar2->cell_br).x;
    auVar3._24_8_ = (pOVar2->cell_br).y;
    auVar12 = vpermpd_avx2(auVar3,0x4e);
    auVar3 = vcmppd_avx(auVar12,auVar3,1);
    auVar12._16_8_ = (pOVar2->cell_br).x;
    auVar12._24_8_ = (pOVar2->cell_br).y;
    VVar1 = pOVar2->cell_tl;
    auVar13._16_8_ = VVar1.x;
    auVar13._24_8_ = VVar1.y;
    auVar13._0_8_ = VVar1.x;
    auVar13._8_8_ = VVar1.y;
    auVar3 = vblendvpd_avx(auVar13,auVar12,auVar3);
    auVar8 = ZEXT1632(CONCAT88(auVar4._8_8_ + auVar7._8_8_,auVar4._0_8_ + auVar7._0_8_)) << 0x80;
    auVar12 = vcmppd_avx(auVar8,auVar3,1);
    auVar13 = vcmppd_avx(auVar3,auVar8,1);
    auVar4 = vpackssdw_avx(auVar12._0_16_,auVar13._16_16_);
    auVar12 = vpmovsxdq_avx2(auVar4);
    auVar3 = vblendvpd_avx(auVar8,auVar3,auVar12);
    (pOVar2->cell_tl).x = (double)SUB168(auVar3._0_16_,0);
    (pOVar2->cell_tl).y = (double)SUB168(auVar3._0_16_,8);
    (pOVar2->cell_br).x = (double)SUB168(auVar3._16_16_,0);
    (pOVar2->cell_br).y = (double)SUB168(auVar3._16_16_,8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[renderer] Selected cell measures ",0x22);
    local_48 = auVar3._0_8_;
    auStack_38._0_8_ = auVar3._16_8_;
    uVar5 = auStack_38._0_8_;
    auStack_38 = auVar3._16_16_;
    poVar6 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,(int)((double)uVar5 - local_48));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
    auVar4 = vsubpd_avx(local_58,auStack_38);
    auVar4 = vshufpd_avx(auVar4,auVar4,1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(int)auVar4._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," pixels",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    (*this->renderer->_vptr_OfflineRenderer[6])();
    (*this->renderer->_vptr_OfflineRenderer[10])();
    return;
  }
  return;
}

Assistant:

void Application::mouse_released(e_mouse_button b) {
  switch (b) {
    case LEFT:
      leftDown = false;
      if (mode == RENDER_MODE && renderer->render_cell) {
        Vector2D tl(max(0.,min(renderer->cell_tl.x,renderer->cell_br.x)),
                    max(0.,min(renderer->cell_tl.y,renderer->cell_br.y)));
        Vector2D br(min(screenW*1.,max(renderer->cell_tl.x,renderer->cell_br.x)),
                    min(screenH*1.,max(renderer->cell_tl.y,renderer->cell_br.y)));
        renderer->cell_tl = tl;
        renderer->cell_br = br;
        cout << "[renderer] Selected cell measures " << (int)(br.x-tl.x) << "x" << (int)(br.y-tl.y) << " pixels" << endl;
        renderer->stop();
        renderer->start_raytracing();
      }
      break;
    case RIGHT:
      if (mode == RENDER_MODE) {
        renderer->autofocus(Vector2D(mouseX, screenH - mouseY));
        renderer->stop();
        renderer->start_raytracing();
      }
      rightDown = false;
      break;
    case MIDDLE:
      middleDown = false;
      break;
  }
}